

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4df131::Handlers::beginAddAttachment(Handlers *this,JSON param_1)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Config CVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Config local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  QPDFJob::Config::addAttachment(&local_28);
  p_Var2 = p_Stack_20;
  CVar1.o = local_28.o;
  local_28.o = (QPDFJob *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->c_att).super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->c_att).super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)CVar1.o;
  (this->c_att).super___shared_ptr<QPDFJob::AttConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return;
}

Assistant:

void
Handlers::beginAddAttachment(JSON)
{
    this->c_att = c_main->addAttachment();
}